

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

wchar_t prt_speed_aux(char *buf,wchar_t max,uint8_t *attr)

{
  byte bVar1;
  wchar_t wVar2;
  ulong uVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 uVar7;
  undefined4 in_register_00000034;
  
  wVar2 = (player->state).speed;
  *(undefined1 *)CONCAT44(in_register_00000034,max) = 1;
  *buf = '\0';
  if ((long)wVar2 < 0x6f) {
    if (wVar2 == L'n') {
      bVar4 = true;
      pcVar6 = (char *)0x0;
      goto LAB_001dd2dd;
    }
    pcVar6 = "Slow";
    uVar7 = 0xf;
  }
  else {
    pcVar6 = "Fast";
    uVar7 = 0xd;
  }
  *(undefined1 *)CONCAT44(in_register_00000034,max) = uVar7;
  bVar4 = false;
LAB_001dd2dd:
  if (!bVar4) {
    if ((player->opts).opt[0x15] == false) {
      strnfmt(buf,0x20,"%s (%+d)",pcVar6,(ulong)(uint)(wVar2 + L'\xffffff92'));
    }
    else {
      bVar1 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [wVar2];
      uVar3 = (ulong)(((uint)bVar1 + (uint)bVar1) * 5) / 10;
      strnfmt(buf,0x20,"%s (%d.%dx)",pcVar6,(ulong)bVar1 / 10,
              (ulong)(uint)((int)uVar3 + (int)(uVar3 / 10) * -10));
    }
  }
  sVar5 = strlen(buf);
  return (wchar_t)sVar5;
}

Assistant:

static int prt_speed_aux(char buf[], int max, uint8_t *attr)
{
	int i = player->state.speed;
	const char *type = NULL;

	*attr = COLOUR_WHITE;
	buf[0] = 0;

	/* 110 is normal speed, and requires no display */
	if (i > 110) {
		*attr = COLOUR_L_GREEN;
		type = "Fast";
	} else if (i < 110) {
		*attr = COLOUR_L_UMBER;
		type = "Slow";
	}

	if (type && !OPT(player, effective_speed))
		strnfmt(buf, max, "%s (%+d)", type, (i - 110));
	else if (type && OPT(player, effective_speed))
	{
		int multiplier = 10 * extract_energy[i] / extract_energy[110];
		int int_mul = multiplier / 10;
		int dec_mul = multiplier % 10;
		strnfmt(buf, max, "%s (%d.%dx)", type, int_mul, dec_mul);
	}

	return strlen(buf);
}